

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ComparisonTestTU<char,signed_char>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<char,signed_char>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<char,signed_char>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<char,_signed_char>::b1 = LessThanTest<char,signed_char>();
      __cxa_guard_release(&ComparisonTestTU<char,signed_char>()::b1);
    }
  }
  if (ComparisonTestTU<char,signed_char>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<char,signed_char>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<char,_signed_char>::b2 = LessThanEqualTest<char,signed_char>();
      __cxa_guard_release(&ComparisonTestTU<char,signed_char>()::b2);
    }
  }
  if (ComparisonTestTU<char,signed_char>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<char,signed_char>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<char,_signed_char>::b3 = GreaterThanTest<char,signed_char>();
      __cxa_guard_release(&ComparisonTestTU<char,signed_char>()::b3);
    }
  }
  if (ComparisonTestTU<char,signed_char>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<char,signed_char>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<char,_signed_char>::b4 = GreaterThanEqualTest<char,signed_char>();
      __cxa_guard_release(&ComparisonTestTU<char,signed_char>()::b4);
    }
  }
  if (ComparisonTestTU<char,signed_char>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<char,signed_char>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<char,_signed_char>::b5 = EqualTest<char,signed_char>();
      __cxa_guard_release(&ComparisonTestTU<char,signed_char>()::b5);
    }
  }
  if (ComparisonTestTU<char,signed_char>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<char,signed_char>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<char,_signed_char>::b6 = NotEqualTest<char,signed_char>();
      __cxa_guard_release(&ComparisonTestTU<char,signed_char>()::b6);
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}